

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  ulong uVar1;
  undefined1 *puVar2;
  long lVar3;
  quint64 *pqVar4;
  long in_FS_OFFSET;
  quint64 c64;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  (*qStoreFromRGBA64PM[rasterBuffer->format])
            ((uchar *)&local_40,color,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  puVar2 = local_40;
  uVar1 = rasterBuffer->bytes_per_line;
  pqVar4 = (quint64 *)(rasterBuffer->m_buffer + (long)y * uVar1 + (long)x * 8);
  lVar3 = (long)width;
  if ((uVar1 & 0xffffffff) == lVar3 * 8) {
    (*qt_memfill64)(pqVar4,(quint64)local_40,height * lVar3);
  }
  else if (0 < height) {
    do {
      (*qt_memfill64)(pqVar4,(quint64)puVar2,lVar3);
      pqVar4 = (quint64 *)((long)pqVar4 + uVar1);
      height = height + -1;
    } while (height != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint64(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    quint64 c64;
    store(reinterpret_cast<uchar *>(&c64), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<quint64>(reinterpret_cast<quint64 *>(rasterBuffer->buffer()),
                         c64, x, y, width, height, rasterBuffer->bytesPerLine());
}